

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>,256,false>>
::
binary_search_impl<std::__cxx11::string,absl::lts_20240722::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>,256,false>>
           *this,undefined8 *k,ulong s,ulong e,StringBtreeDefaultLess *comp)

{
  weak_ordering wVar1;
  template_ElementType<3UL> *ptVar2;
  ulong extraout_RDX;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  SearchResult<unsigned_long,_true> SVar6;
  string_view lhs;
  string_view rhs;
  
  uVar5 = s;
  do {
    while( true ) {
      if (uVar5 == e) {
        uVar3 = CONCAT71((int7)(s >> 8),1);
        goto LAB_001aa230;
      }
      uVar4 = e + uVar5 >> 1;
      ptVar2 = GetField<3ul>(this);
      lhs._M_str = ptVar2[uVar4].value.first._M_dataplus._M_p;
      lhs._M_len = *(size_t *)((long)ptVar2 + uVar4 * 0x68 + 8);
      rhs._M_str = (char *)*k;
      rhs._M_len = k[1];
      wVar1 = StringBtreeDefaultLess::operator()(comp,lhs,rhs);
      s = extraout_RDX;
      if (-1 < wVar1.value_) break;
      uVar5 = uVar4 + 1;
    }
    e = uVar4;
  } while (wVar1.value_ != '\0');
  uVar3 = 0;
LAB_001aa230:
  SVar6._8_8_ = uVar3;
  SVar6.value = e;
  return SVar6;
}

Assistant:

SearchResult<size_type, true> binary_search_impl(
      const K &k, size_type s, size_type e, const CompareTo &comp,
      std::true_type /* IsCompareTo */) const {
    if (params_type::template can_have_multiple_equivalent_keys<K>()) {
      MatchKind exact_match = MatchKind::kNe;
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else {
          e = mid;
          if (c == 0) {
            // Need to return the first value whose key is not less than k,
            // which requires continuing the binary search if there could be
            // multiple equivalent keys.
            exact_match = MatchKind::kEq;
          }
        }
      }
      return {s, exact_match};
    } else {  // Can't have multiple equivalent keys.
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else if (c > 0) {
          e = mid;
        } else {
          return {mid, MatchKind::kEq};
        }
      }
      return {s, MatchKind::kNe};
    }
  }